

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_poc(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  uint uVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  uint local_84;
  opj_tcp_t *local_80;
  opj_poc_t *local_78;
  opj_poc_t *l_current_poc;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  OPJ_UINT32 l_comp_room;
  OPJ_UINT32 l_chunk_size;
  OPJ_UINT32 l_current_poc_remaining;
  OPJ_UINT32 l_current_poc_nb;
  OPJ_UINT32 l_old_poc_nb;
  opj_image_t *l_image;
  uint local_38;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 l_nb_comp;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *p_j2k_local;
  
  _l_nb_comp = p_manager;
  p_manager_local._4_4_ = p_header_size;
  pOStack_20 = p_header_data;
  p_header_data_local = (OPJ_BYTE *)p_j2k;
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xdd3,
                  "OPJ_BOOL opj_j2k_read_poc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      local_38 = p_j2k->m_private_image->numcomps;
      if (local_38 < 0x101) {
        l_cp._4_4_ = 1;
      }
      else {
        l_cp._4_4_ = 2;
      }
      uVar1 = l_cp._4_4_ * 2 + 5;
      uVar2 = p_header_size / uVar1;
      if ((uVar2 == 0) || (p_header_size % uVar1 != 0)) {
        opj_event_msg(p_manager,1,"Error reading POC marker\n");
        p_j2k_local._4_4_ = 0;
      }
      else {
        if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
          local_80 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
        }
        else {
          local_80 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
        }
        if (((byte)local_80->field_0x1638 >> 2 & 1) == 0) {
          local_84 = 0;
        }
        else {
          local_84 = local_80->numpocs + 1;
        }
        uVar2 = local_84 + uVar2;
        if (uVar2 < 0x20) {
          local_80->field_0x1638 = local_80->field_0x1638 & 0xfb | 4;
          local_78 = local_80->pocs + local_84;
          for (l_tmp = local_84; l_tmp < uVar2; l_tmp = l_tmp + 1) {
            opj_read_bytes_LE(pOStack_20,&local_78->resno0,1);
            pOStack_20 = pOStack_20 + 1;
            opj_read_bytes_LE(pOStack_20,&local_78->compno0,l_cp._4_4_);
            pOStack_20 = pOStack_20 + l_cp._4_4_;
            opj_read_bytes_LE(pOStack_20,&local_78->layno1,2);
            OVar3 = opj_uint_min(local_78->layno1,local_80->numlayers);
            local_78->layno1 = OVar3;
            pOStack_20 = pOStack_20 + 2;
            opj_read_bytes_LE(pOStack_20,&local_78->resno1,1);
            pOStack_20 = pOStack_20 + 1;
            opj_read_bytes_LE(pOStack_20,&local_78->compno1,l_cp._4_4_);
            pOStack_20 = pOStack_20 + l_cp._4_4_;
            opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&l_image + 4),1);
            pOStack_20 = pOStack_20 + 1;
            local_78->prg = l_image._4_4_;
            OVar3 = opj_uint_min(local_78->compno1,local_38);
            local_78->compno1 = OVar3;
            local_78 = local_78 + 1;
          }
          local_80->numpocs = uVar2 - 1;
          p_j2k_local._4_4_ = 1;
        }
        else {
          opj_event_msg(p_manager,1,"Too many POCs %d\n",(ulong)uVar2);
          p_j2k_local._4_4_ = 0;
        }
      }
      return p_j2k_local._4_4_;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xdd5,
                  "OPJ_BOOL opj_j2k_read_poc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0xdd4,
                "OPJ_BOOL opj_j2k_read_poc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)")
  ;
}

Assistant:

static OPJ_BOOL opj_j2k_read_poc(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 i, l_nb_comp, l_tmp;
    opj_image_t * l_image = 00;
    OPJ_UINT32 l_old_poc_nb, l_current_poc_nb, l_current_poc_remaining;
    OPJ_UINT32 l_chunk_size, l_comp_room;

    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    opj_poc_t *l_current_poc = 00;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_image = p_j2k->m_private_image;
    l_nb_comp = l_image->numcomps;
    if (l_nb_comp <= 256) {
        l_comp_room = 1;
    } else {
        l_comp_room = 2;
    }
    l_chunk_size = 5 + 2 * l_comp_room;
    l_current_poc_nb = p_header_size / l_chunk_size;
    l_current_poc_remaining = p_header_size % l_chunk_size;

    if ((l_current_poc_nb <= 0) || (l_current_poc_remaining != 0)) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading POC marker\n");
        return OPJ_FALSE;
    }

    l_cp = &(p_j2k->m_cp);
    l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
            &l_cp->tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;
    l_old_poc_nb = l_tcp->POC ? l_tcp->numpocs + 1 : 0;
    l_current_poc_nb += l_old_poc_nb;

    if (l_current_poc_nb >= J2K_MAX_POCS) {
        opj_event_msg(p_manager, EVT_ERROR, "Too many POCs %d\n", l_current_poc_nb);
        return OPJ_FALSE;
    }

    /* now poc is in use.*/
    l_tcp->POC = 1;

    l_current_poc = &l_tcp->pocs[l_old_poc_nb];
    for (i = l_old_poc_nb; i < l_current_poc_nb; ++i) {
        opj_read_bytes(p_header_data, &(l_current_poc->resno0),
                       1);                               /* RSpoc_i */
        ++p_header_data;
        opj_read_bytes(p_header_data, &(l_current_poc->compno0),
                       l_comp_room);  /* CSpoc_i */
        p_header_data += l_comp_room;
        opj_read_bytes(p_header_data, &(l_current_poc->layno1),
                       2);                               /* LYEpoc_i */
        /* make sure layer end is in acceptable bounds */
        l_current_poc->layno1 = opj_uint_min(l_current_poc->layno1, l_tcp->numlayers);
        p_header_data += 2;
        opj_read_bytes(p_header_data, &(l_current_poc->resno1),
                       1);                               /* REpoc_i */
        ++p_header_data;
        opj_read_bytes(p_header_data, &(l_current_poc->compno1),
                       l_comp_room);  /* CEpoc_i */
        p_header_data += l_comp_room;
        opj_read_bytes(p_header_data, &l_tmp,
                       1);                                                                 /* Ppoc_i */
        ++p_header_data;
        l_current_poc->prg = (OPJ_PROG_ORDER) l_tmp;
        /* make sure comp is in acceptable bounds */
        l_current_poc->compno1 = opj_uint_min(l_current_poc->compno1, l_nb_comp);
        ++l_current_poc;
    }

    l_tcp->numpocs = l_current_poc_nb - 1;
    return OPJ_TRUE;
}